

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtransaction.cpp
# Opt level: O3

void __thiscall
ConfidentialTransaction_PeginWitnessTest_Test::TestBody
          (ConfidentialTransaction_PeginWitnessTest_Test *this)

{
  ByteData256 BVar1;
  ByteData256 BVar2;
  ConfidentialValue CVar3;
  ConfidentialValue CVar4;
  ByteData BVar5;
  ByteData BVar6;
  pointer puVar7;
  bool bVar8;
  pointer puVar9;
  char *pcVar10;
  ulong uVar11;
  pointer in_stack_fffffffffffffc48;
  AssertionResult gtest_ar_6;
  pointer local_3a0;
  undefined8 uStack_398;
  AssertionResult gtest_ar_4;
  undefined8 uStack_380;
  ByteData160 *local_378;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_370;
  ScriptWitness witness;
  AssertionResult gtest_ar;
  pointer local_328;
  pointer puStack_320;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_1f0;
  ByteData256 local_1d8;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> tx_peg_vector;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> test_peg_vector;
  ByteData160 exp_data160;
  ConfidentialTransaction tx;
  ByteData256 exp_data256;
  ByteData exp_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_100;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_e8;
  ConfidentialValue local_d0;
  ConfidentialValue local_a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  ScriptWitness exp_pegin_witness;
  
  GetExpectPeginWitnessStack();
  gtest_ar.success_ = SUB81(&local_328,0);
  gtest_ar._1_7_ = SUB87((ulong)&local_328 >> 8,0);
  std::__cxx11::string::_M_construct<char_const*>((string *)&gtest_ar,"1234567890","");
  cfd::core::ByteData::ByteData(&exp_data,(string *)&gtest_ar);
  if ((pointer *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != &local_328) {
    operator_delete((pointer *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
  }
  gtest_ar.success_ = SUB81(&local_328,0);
  gtest_ar._1_7_ = SUB87((ulong)&local_328 >> 8,0);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gtest_ar,"1234567890123456789012345678901234567890","");
  cfd::core::ByteData160::ByteData160(&exp_data160,(string *)&gtest_ar);
  if ((pointer *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != &local_328) {
    operator_delete((pointer *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
  }
  gtest_ar.success_ = SUB81(&local_328,0);
  gtest_ar._1_7_ = SUB87((ulong)&local_328 >> 8,0);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gtest_ar,"1234567890123456789012345678901234567890123456789012345678901234",
             "");
  cfd::core::ByteData256::ByteData256(&exp_data256,(string *)&gtest_ar);
  if ((pointer *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != &local_328) {
    operator_delete((pointer *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
  }
  cfd::core::ScriptWitness::GetWitness();
  cfd::core::ByteData256::ByteData256(&local_1d8);
  cfd::core::ConfidentialTransaction::ConfidentialTransaction(&tx,(string *)&exp_tx_hex_abi_cxx11_);
  bVar8 = testing::internal::AlwaysTrue();
  if (bVar8) {
    bVar8 = testing::internal::AlwaysTrue();
    local_378 = (ByteData160 *)0x0;
    if (bVar8) {
      local_378 = (ByteData160 *)
                  cfd::core::ConfidentialTransaction::AddTxIn
                            ((Txid *)&tx,0x4e9ee8,2,(Script *)0xfffffffe);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&witness,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x129,
               "Expected: (index = tx.AddTxIn(exp_txid, exp_index, exp_sequence, exp_script)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&witness,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&witness);
    if (CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != 0) {
      bVar8 = testing::internal::IsTrue(true);
      if ((bVar8) && ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
      }
    }
    local_378 = (ByteData160 *)0x0;
  }
  bVar8 = testing::internal::AlwaysTrue();
  if (bVar8) {
    bVar8 = testing::internal::AlwaysTrue();
    if (bVar8) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_e8,&exp_blinding_nonce.data_);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_100,&exp_asset_entropy.data_);
      cfd::core::ConfidentialValue::ConfidentialValue(&local_a8,&exp_issuance_amount);
      cfd::core::ConfidentialValue::ConfidentialValue(&local_d0,&exp_inflation_keys);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_68,&exp_issuance_amount_rangeproof.data_);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&local_80,&exp_inflation_keys_rangeproof.data_);
      BVar1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)&local_80;
      BVar1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&local_68;
      BVar1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffc48;
      BVar2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ = gtest_ar_6._4_4_;
      BVar2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ = gtest_ar_6.success_;
      BVar2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._1_3_ = gtest_ar_6._1_3_;
      BVar2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)gtest_ar_6.message_.ptr_;
      BVar2.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_3a0;
      CVar3.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ = gtest_ar_4.success_;
      CVar3.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._1_3_ = gtest_ar_4._1_3_;
      CVar3._vptr_ConfidentialValue = (_func_int **)uStack_398;
      CVar3.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._4_4_ = gtest_ar_4._4_4_;
      CVar3.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)gtest_ar_4.message_.ptr_;
      CVar3.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)uStack_380;
      CVar3._32_8_ = local_378;
      CVar4.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)local_370.
                    super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
      CVar4._vptr_ConfidentialValue =
           (_func_int **)
           local_370.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
           _M_impl.super__Vector_impl_data._M_start;
      CVar4.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)local_370.
                    super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
      CVar4.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = witness._vptr_ScriptWitness._0_4_;
      CVar4.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = witness._vptr_ScriptWitness._4_4_;
      CVar4._32_8_ = witness.witness_stack_.
                     super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      BVar5.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)witness.witness_stack_.
                    super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
      BVar5.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)witness.witness_stack_.
                    super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
      BVar5.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_1_ = gtest_ar.success_;
      BVar5.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._1_7_ = gtest_ar._1_7_;
      BVar6.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = local_328;
      BVar6.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)gtest_ar.message_.ptr_;
      BVar6.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = puStack_320;
      cfd::core::ConfidentialTransaction::SetIssuance((uint)&tx,BVar1,BVar2,CVar3,CVar4,BVar5,BVar6)
      ;
      if (local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      local_d0._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_004e0f10;
      if (local_d0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d0.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_a8._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_004e0f10;
      if (local_a8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_100.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_100.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&witness,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x12e,
               "Expected: (tx.SetIssuance(index, exp_blinding_nonce, exp_asset_entropy, exp_issuance_amount, exp_inflation_keys, exp_issuance_amount_rangeproof, exp_inflation_keys_rangeproof)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&witness,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&witness);
    if (CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != 0) {
      bVar8 = testing::internal::IsTrue(true);
      if ((bVar8) && ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
      }
    }
  }
  witness._vptr_ScriptWitness._0_4_ =
       cfd::core::ConfidentialTransaction::GetPeginWitnessStackNum((uint)&tx);
  gtest_ar_6.success_ = false;
  gtest_ar_6._1_3_ = 0;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"tx.GetPeginWitnessStackNum(index)","0",(uint *)&witness,
             (int *)&gtest_ar_6);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&witness);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x12f,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&witness);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
    if (CONCAT44(witness._vptr_ScriptWitness._4_4_,witness._vptr_ScriptWitness._0_4_) != 0) {
      bVar8 = testing::internal::IsTrue(true);
      if ((bVar8) &&
         ((long *)CONCAT44(witness._vptr_ScriptWitness._4_4_,witness._vptr_ScriptWitness._0_4_) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(witness._vptr_ScriptWitness._4_4_,
                                       witness._vptr_ScriptWitness._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  bVar8 = testing::internal::AlwaysTrue();
  if (bVar8) {
    bVar8 = testing::internal::AlwaysTrue();
    if (bVar8) {
      cfd::core::ConfidentialTransaction::GetWitnessOnlyHash();
      puVar7 = local_1d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar9 = (pointer)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
      local_1d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)gtest_ar.message_.ptr_;
      local_1d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_328;
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_328 = (pointer)0x0;
      bVar8 = local_1d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0;
      local_1d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = puVar9;
      if (bVar8) {
        operator_delete(puVar7);
        if ((void *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (void *)0x0) {
          operator_delete((void *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        }
      }
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&witness,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x132,
               "Expected: (witness_only_hash = tx.GetWitnessOnlyHash()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&witness,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&witness);
    if (CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != 0) {
      bVar8 = testing::internal::IsTrue(true);
      if ((bVar8) && ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
      }
    }
  }
  cfd::core::ByteData256::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&witness,"witness_only_hash.GetHex().c_str()",
             "\"5e1940c383c21cc75720f61fcc7cf95a056239ce73d5bd1cee1ff0c578bbcf99\"",
             (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_),
             "5e1940c383c21cc75720f61fcc7cf95a056239ce73d5bd1cee1ff0c578bbcf99");
  if ((pointer *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != &local_328) {
    operator_delete((pointer *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
  }
  if ((char)witness._vptr_ScriptWitness == '\0') {
    testing::Message::Message((Message *)&gtest_ar);
    if (witness.witness_stack_.
        super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      puVar9 = "";
    }
    else {
      puVar9 = ((witness.witness_stack_.
                 super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                 _M_impl.super__Vector_impl_data._M_start)->data_).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x135,(char *)puVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
    if (CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != 0) {
      bVar8 = testing::internal::IsTrue(true);
      if ((bVar8) && ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&witness.witness_stack_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  witness._vptr_ScriptWitness._0_4_ = 0x4d2f88;
  witness._vptr_ScriptWitness._4_4_ = 0;
  witness.witness_stack_.
  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  witness.witness_stack_.
  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  witness.witness_stack_.
  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_370.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_370.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    uVar11 = 0;
    do {
      bVar8 = testing::internal::AlwaysTrue();
      if (bVar8) {
        bVar8 = testing::internal::AlwaysTrue();
        if (bVar8) {
          cfd::core::ConfidentialTransaction::AddPeginWitnessStack((uint)&gtest_ar,(ByteData *)&tx);
          std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
                    (&witness.witness_stack_,
                     (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                     &gtest_ar.message_);
          gtest_ar.success_ = true;
          gtest_ar._1_7_ = 0x4d2f;
          std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                    ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                     &gtest_ar.message_);
        }
      }
      else {
        testing::Message::Message((Message *)&gtest_ar);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
                   ,0x13b,
                   "Expected: (witness = tx.AddPeginWitnessStack(index, exp_peg_vector[idx])) doesn\'t throw an exception.\n  Actual: it throws."
                  );
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&gtest_ar)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
        if (CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != 0) {
          bVar8 = testing::internal::IsTrue(true);
          if ((bVar8) && ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
          }
        }
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < (ulong)(((long)local_370.
                                     super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_370.
                                     super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x5555555555555555));
  }
  cfd::core::ScriptWitness::GetWitness();
  if (local_370.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_370.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    uVar11 = 0;
    do {
      cfd::core::ByteData::GetHex_abi_cxx11_();
      pcVar10 = (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
      cfd::core::ByteData::GetHex_abi_cxx11_();
      testing::internal::CmpHelperSTREQ
                ((internal *)&tx_peg_vector,"test_peg_vector[idx].GetHex().c_str()",
                 "exp_peg_vector[idx].GetHex().c_str()",pcVar10,
                 (char *)CONCAT44(gtest_ar_6._4_4_,gtest_ar_6._0_4_));
      if ((pointer *)CONCAT44(gtest_ar_6._4_4_,gtest_ar_6._0_4_) != &local_3a0) {
        operator_delete((pointer *)CONCAT44(gtest_ar_6._4_4_,gtest_ar_6._0_4_));
      }
      if ((pointer *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != &local_328) {
        operator_delete((pointer *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
      }
      if ((char)tx_peg_vector.
                super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                _M_impl.super__Vector_impl_data._M_start == '\0') {
        testing::Message::Message((Message *)&gtest_ar);
        puVar9 = "";
        if (tx_peg_vector.
            super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
            super__Vector_impl_data._M_finish != (pointer)0x0) {
          puVar9 = ((tx_peg_vector.
                     super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                     _M_impl.super__Vector_impl_data._M_finish)->data_).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
                   ,0x140,(char *)puVar9);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&gtest_ar)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
        if (CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != 0) {
          bVar8 = testing::internal::IsTrue(true);
          if ((bVar8) && ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&tx_peg_vector.
                super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                _M_impl.super__Vector_impl_data._M_finish,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      uVar11 = uVar11 + 1;
    } while (uVar11 < (ulong)(((long)local_370.
                                     super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_370.
                                     super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x5555555555555555));
  }
  cfd::core::ConfidentialTransaction::GetTxIn((uint)&gtest_ar);
  gtest_ar_6.success_ = true;
  gtest_ar_6._1_3_ = 0x4d2f;
  gtest_ar_6._4_4_ = 0;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &gtest_ar_6.message_,&local_1f0);
  cfd::core::ScriptWitness::GetWitness();
  gtest_ar_6.success_ = true;
  gtest_ar_6._1_3_ = 0x4d2f;
  gtest_ar_6._4_4_ = 0;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &gtest_ar_6.message_);
  cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference
            ((ConfidentialTxInReference *)&gtest_ar);
  if (tx_peg_vector.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (pointer)CONCAT71(tx_peg_vector.
                        super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                        ._M_impl.super__Vector_impl_data._M_start._1_7_,
                        (char)tx_peg_vector.
                              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                              ._M_impl.super__Vector_impl_data._M_start)) {
    uVar11 = 0;
    do {
      cfd::core::ByteData::GetHex_abi_cxx11_();
      pcVar10 = (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
      cfd::core::ByteData::GetHex_abi_cxx11_();
      testing::internal::CmpHelperSTREQ
                ((internal *)&gtest_ar_4,"test_peg_vector[idx].GetHex().c_str()",
                 "tx_peg_vector[idx].GetHex().c_str()",pcVar10,
                 (char *)CONCAT44(gtest_ar_6._4_4_,gtest_ar_6._0_4_));
      if ((pointer *)CONCAT44(gtest_ar_6._4_4_,gtest_ar_6._0_4_) != &local_3a0) {
        operator_delete((pointer *)CONCAT44(gtest_ar_6._4_4_,gtest_ar_6._0_4_));
      }
      if ((pointer *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != &local_328) {
        operator_delete((pointer *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
      }
      if (gtest_ar_4.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar);
        pcVar10 = "";
        if (gtest_ar_4.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar10 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
                   ,0x146,pcVar10);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&gtest_ar)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
        if (CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != 0) {
          bVar8 = testing::internal::IsTrue(true);
          if ((bVar8) && ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar_4.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      uVar11 = uVar11 + 1;
    } while (uVar11 < (ulong)(((long)tx_peg_vector.
                                     super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               CONCAT71(tx_peg_vector.
                                        super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                        ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                        (char)tx_peg_vector.
                                              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                             -0x5555555555555555));
  }
  gtest_ar_4._0_4_ = cfd::core::ConfidentialTransaction::GetPeginWitnessStackNum((uint)&tx);
  gtest_ar_6._0_8_ =
       ((long)local_370.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_370.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&gtest_ar,"tx.GetPeginWitnessStackNum(index)","exp_peg_vector.size()",
             (uint *)&gtest_ar_4,(unsigned_long *)&gtest_ar_6);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_6);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x148,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&gtest_ar_6);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    if (gtest_ar_6._0_8_ != 0) {
      bVar8 = testing::internal::IsTrue(true);
      if ((bVar8) && (gtest_ar_6._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_6._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  bVar8 = testing::internal::AlwaysTrue();
  if (bVar8) {
    bVar8 = testing::internal::AlwaysTrue();
    if (bVar8) {
      cfd::core::ConfidentialTransaction::GetWitnessOnlyHash();
      puVar7 = local_1d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar9 = (pointer)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
      local_1d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)gtest_ar.message_.ptr_;
      local_1d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_328;
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_328 = (pointer)0x0;
      bVar8 = local_1d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0;
      local_1d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = puVar9;
      if (bVar8) {
        operator_delete(puVar7);
        if ((void *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (void *)0x0) {
          operator_delete((void *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        }
      }
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x14b,
               "Expected: (witness_only_hash = tx.GetWitnessOnlyHash()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
    if (CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != 0) {
      bVar8 = testing::internal::IsTrue(true);
      if ((bVar8) && ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
      }
    }
  }
  cfd::core::ByteData256::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_6,"witness_only_hash.GetHex().c_str()",
             "\"7d3c4a5dbe536fd91715b2560826eae62f014cdefa02a0291b5c7dd9f3ad6b3a\"",
             (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_),
             "7d3c4a5dbe536fd91715b2560826eae62f014cdefa02a0291b5c7dd9f3ad6b3a");
  if ((pointer *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != &local_328) {
    operator_delete((pointer *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
  }
  if (gtest_ar_6.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_6.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((gtest_ar_6.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x14e,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    if (CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != 0) {
      bVar8 = testing::internal::IsTrue(true);
      if ((bVar8) && ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_6.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar8 = testing::internal::AlwaysTrue();
  if (bVar8) {
    cfd::core::ConfidentialTransaction::AddPeginWitnessStack((uint)&gtest_ar,(ByteData160 *)&tx);
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
              (&witness.witness_stack_,
               (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
               &gtest_ar.message_);
    gtest_ar.success_ = true;
    gtest_ar._1_7_ = 0x4d2f;
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
              ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
               &gtest_ar.message_);
  }
  testing::Message::Message((Message *)&gtest_ar);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
             ,0x152,
             "Expected: (witness = tx.AddPeginWitnessStack(index + 5, exp_data160)) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
  if (CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != 0) {
    bVar8 = testing::internal::IsTrue(true);
    if ((bVar8) && ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
    }
  }
  bVar8 = testing::internal::AlwaysTrue();
  if (bVar8) {
    bVar8 = testing::internal::AlwaysTrue();
    if (bVar8) {
      cfd::core::ConfidentialTransaction::AddPeginWitnessStack((uint)&gtest_ar,(ByteData160 *)&tx);
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
                (&witness.witness_stack_,
                 (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                 &gtest_ar.message_);
      gtest_ar.success_ = true;
      gtest_ar._1_7_ = 0x4d2f;
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                 &gtest_ar.message_);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x153,
               "Expected: (witness = tx.AddPeginWitnessStack(index, exp_data160)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
    if (CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != 0) {
      bVar8 = testing::internal::IsTrue(true);
      if ((bVar8) && ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
      }
    }
  }
  bVar8 = testing::internal::AlwaysTrue();
  if (bVar8) {
    bVar8 = testing::internal::AlwaysTrue();
    if (bVar8) {
      cfd::core::ConfidentialTransaction::AddPeginWitnessStack((uint)&gtest_ar,(ByteData256 *)&tx);
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
                (&witness.witness_stack_,
                 (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                 &gtest_ar.message_);
      gtest_ar.success_ = true;
      gtest_ar._1_7_ = 0x4d2f;
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                 &gtest_ar.message_);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x154,
               "Expected: (witness = tx.AddPeginWitnessStack(index, exp_data256)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
    if (CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != 0) {
      bVar8 = testing::internal::IsTrue(true);
      if ((bVar8) && ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
      }
    }
  }
  cfd::core::ScriptWitness::GetWitness();
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
            (&test_peg_vector,
             (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&gtest_ar);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&gtest_ar);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar10 = (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
  cfd::core::ByteData160::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_4,"test_peg_vector[exp_peg_vector.size()].GetHex().c_str()",
             "exp_data160.GetHex().c_str()",pcVar10,(char *)gtest_ar_6._0_8_);
  if ((pointer *)gtest_ar_6._0_8_ != &local_3a0) {
    operator_delete((void *)gtest_ar_6._0_8_);
  }
  if ((pointer *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != &local_328) {
    operator_delete((pointer *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
  }
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_4.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x157,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
    if (CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != 0) {
      bVar8 = testing::internal::IsTrue(true);
      if ((bVar8) && ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_4.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar10 = (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
  cfd::core::ByteData256::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_4,"test_peg_vector[exp_peg_vector.size() + 1].GetHex().c_str()",
             "exp_data256.GetHex().c_str()",pcVar10,(char *)gtest_ar_6._0_8_);
  if ((pointer *)gtest_ar_6._0_8_ != &local_3a0) {
    operator_delete((void *)gtest_ar_6._0_8_);
  }
  if ((pointer *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != &local_328) {
    operator_delete((pointer *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
  }
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_4.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x159,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
    if (CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != 0) {
      bVar8 = testing::internal::IsTrue(true);
      if ((bVar8) && ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_4.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  gtest_ar_4._0_4_ = cfd::core::ConfidentialTransaction::GetPeginWitnessStackNum((uint)&tx);
  gtest_ar_6._0_8_ =
       ((long)local_370.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_370.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 + 2;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&gtest_ar,"tx.GetPeginWitnessStackNum(index)","exp_peg_vector.size() + 2",
             (uint *)&gtest_ar_4,(unsigned_long *)&gtest_ar_6);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_6);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x15a,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&gtest_ar_6);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    if (gtest_ar_6._0_8_ != 0) {
      bVar8 = testing::internal::IsTrue(true);
      if ((bVar8) && (gtest_ar_6._0_8_ != 0)) {
        (**(code **)(*(long *)gtest_ar_6._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  bVar8 = testing::internal::AlwaysTrue();
  if (bVar8) {
    bVar8 = testing::internal::AlwaysTrue();
    if (bVar8) {
      cfd::core::ConfidentialTransaction::GetWitnessOnlyHash();
      puVar7 = local_1d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar9 = (pointer)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
      local_1d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)gtest_ar.message_.ptr_;
      local_1d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_328;
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_328 = (pointer)0x0;
      bVar8 = local_1d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0;
      local_1d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = puVar9;
      if (bVar8) {
        operator_delete(puVar7);
        if ((void *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (void *)0x0) {
          operator_delete((void *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        }
      }
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x15d,
               "Expected: (witness_only_hash = tx.GetWitnessOnlyHash()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
    if (CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != 0) {
      bVar8 = testing::internal::IsTrue(true);
      if ((bVar8) && ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
      }
    }
  }
  cfd::core::ByteData256::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_6,"witness_only_hash.GetHex().c_str()",
             "\"ab4c6b401c0a47da16ee3b9135960bbfe7175de798ba398bbd6810b4fbbbcecf\"",
             (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_),
             "ab4c6b401c0a47da16ee3b9135960bbfe7175de798ba398bbd6810b4fbbbcecf");
  if ((pointer *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != &local_328) {
    operator_delete((pointer *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
  }
  if (gtest_ar_6.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_6.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((gtest_ar_6.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x160,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    if (CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != 0) {
      bVar8 = testing::internal::IsTrue(true);
      if ((bVar8) && ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_6.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar8 = testing::internal::AlwaysTrue();
  if (bVar8) {
    cfd::core::ConfidentialTransaction::SetPeginWitnessStack
              ((uint)&gtest_ar,(uint)&tx,(ByteData160 *)(ulong)((int)local_378 + 5));
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
              (&witness.witness_stack_,
               (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
               &gtest_ar.message_);
    gtest_ar.success_ = true;
    gtest_ar._1_7_ = 0x4d2f;
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
              ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
               &gtest_ar.message_);
  }
  testing::Message::Message((Message *)&gtest_ar);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
             ,0x166,
             "Expected: (witness = tx.SetPeginWitnessStack(index + 5, static_cast<size_t>(exp_peg_vector.size()), exp_data160)) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
  if (CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != 0) {
    bVar8 = testing::internal::IsTrue(true);
    if ((bVar8) && ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
    }
  }
  bVar8 = testing::internal::AlwaysTrue();
  if (bVar8) {
    cfd::core::ConfidentialTransaction::SetPeginWitnessStack((uint)&gtest_ar,(uint)&tx,local_378);
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
              (&witness.witness_stack_,
               (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
               &gtest_ar.message_);
    gtest_ar.success_ = true;
    gtest_ar._1_7_ = 0x4d2f;
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
              ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
               &gtest_ar.message_);
  }
  testing::Message::Message((Message *)&gtest_ar);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
             ,0x16a,
             "Expected: (witness = tx.SetPeginWitnessStack(index, static_cast<size_t>(exp_peg_vector.size()) + 5, exp_data160)) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
  if (CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != 0) {
    bVar8 = testing::internal::IsTrue(true);
    if ((bVar8) && ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
    }
  }
  bVar8 = testing::internal::AlwaysTrue();
  if (bVar8) {
    bVar8 = testing::internal::AlwaysTrue();
    if (bVar8) {
      cfd::core::ConfidentialTransaction::SetPeginWitnessStack
                ((uint)&gtest_ar,(uint)&tx,(ByteData *)local_378);
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
                (&witness.witness_stack_,
                 (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                 &gtest_ar.message_);
      gtest_ar.success_ = true;
      gtest_ar._1_7_ = 0x4d2f;
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                 &gtest_ar.message_);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x16b,
               "Expected: (witness = tx.SetPeginWitnessStack(index, 0, exp_data)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
    if (CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != 0) {
      bVar8 = testing::internal::IsTrue(true);
      if ((bVar8) && ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
      }
    }
  }
  bVar8 = testing::internal::AlwaysTrue();
  if (bVar8) {
    bVar8 = testing::internal::AlwaysTrue();
    if (bVar8) {
      cfd::core::ConfidentialTransaction::SetPeginWitnessStack
                ((uint)&gtest_ar,(uint)&tx,(ByteData256 *)local_378);
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
                (&witness.witness_stack_,
                 (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                 &gtest_ar.message_);
      gtest_ar.success_ = true;
      gtest_ar._1_7_ = 0x4d2f;
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                 &gtest_ar.message_);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x16e,
               "Expected: (witness = tx.SetPeginWitnessStack(index, static_cast<size_t>(exp_peg_vector.size()), exp_data256)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
    if (CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != 0) {
      bVar8 = testing::internal::IsTrue(true);
      if ((bVar8) && ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
      }
    }
  }
  bVar8 = testing::internal::AlwaysTrue();
  if (bVar8) {
    bVar8 = testing::internal::AlwaysTrue();
    if (bVar8) {
      cfd::core::ConfidentialTransaction::SetPeginWitnessStack((uint)&gtest_ar,(uint)&tx,local_378);
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
                (&witness.witness_stack_,
                 (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                 &gtest_ar.message_);
      gtest_ar.success_ = true;
      gtest_ar._1_7_ = 0x4d2f;
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                 &gtest_ar.message_);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x171,
               "Expected: (witness = tx.SetPeginWitnessStack(index, static_cast<size_t>(exp_peg_vector.size()) + 1, exp_data160)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
    if (CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != 0) {
      bVar8 = testing::internal::IsTrue(true);
      if ((bVar8) && ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
      }
    }
  }
  cfd::core::ScriptWitness::GetWitness();
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
            (&test_peg_vector,
             (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&gtest_ar);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&gtest_ar);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar10 = (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_4,"test_peg_vector[0].GetHex().c_str()",
             "exp_data.GetHex().c_str()",pcVar10,(char *)gtest_ar_6._0_8_);
  if ((pointer *)gtest_ar_6._0_8_ != &local_3a0) {
    operator_delete((void *)gtest_ar_6._0_8_);
  }
  if ((pointer *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != &local_328) {
    operator_delete((pointer *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
  }
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_4.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x173,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
    if (CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != 0) {
      bVar8 = testing::internal::IsTrue(true);
      if ((bVar8) && ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_4.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar10 = (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
  cfd::core::ByteData256::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_4,"test_peg_vector[exp_peg_vector.size()].GetHex().c_str()",
             "exp_data256.GetHex().c_str()",pcVar10,(char *)gtest_ar_6._0_8_);
  if ((pointer *)gtest_ar_6._0_8_ != &local_3a0) {
    operator_delete((void *)gtest_ar_6._0_8_);
  }
  if ((pointer *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != &local_328) {
    operator_delete((pointer *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
  }
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_4.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x175,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
    if (CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != 0) {
      bVar8 = testing::internal::IsTrue(true);
      if ((bVar8) && ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_4.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar10 = (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
  cfd::core::ByteData160::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_4,"test_peg_vector[exp_peg_vector.size() + 1].GetHex().c_str()",
             "exp_data160.GetHex().c_str()",pcVar10,(char *)gtest_ar_6._0_8_);
  if ((pointer *)gtest_ar_6._0_8_ != &local_3a0) {
    operator_delete((void *)gtest_ar_6._0_8_);
  }
  if ((pointer *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != &local_328) {
    operator_delete((pointer *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
  }
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_4.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x177,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
    if (CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != 0) {
      bVar8 = testing::internal::IsTrue(true);
      if ((bVar8) && ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_4.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialTransaction::GetTxIn((uint)&gtest_ar);
  gtest_ar_6.success_ = true;
  gtest_ar_6._1_3_ = 0x4d2f;
  gtest_ar_6._4_4_ = 0;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &gtest_ar_6.message_,&local_1f0);
  cfd::core::ScriptWitness::GetWitness();
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator=
            (&tx_peg_vector,
             (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&gtest_ar_4);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&gtest_ar_4);
  gtest_ar_6.success_ = true;
  gtest_ar_6._1_3_ = 0x4d2f;
  gtest_ar_6._4_4_ = 0;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &gtest_ar_6.message_);
  cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference
            ((ConfidentialTxInReference *)&gtest_ar);
  if (tx_peg_vector.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (pointer)CONCAT71(tx_peg_vector.
                        super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                        ._M_impl.super__Vector_impl_data._M_start._1_7_,
                        (char)tx_peg_vector.
                              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                              ._M_impl.super__Vector_impl_data._M_start)) {
    uVar11 = 0;
    do {
      cfd::core::ByteData::GetHex_abi_cxx11_();
      pcVar10 = (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
      cfd::core::ByteData::GetHex_abi_cxx11_();
      testing::internal::CmpHelperSTREQ
                ((internal *)&gtest_ar_4,"test_peg_vector[idx].GetHex().c_str()",
                 "tx_peg_vector[idx].GetHex().c_str()",pcVar10,
                 (char *)CONCAT44(gtest_ar_6._4_4_,gtest_ar_6._0_4_));
      if ((pointer *)CONCAT44(gtest_ar_6._4_4_,gtest_ar_6._0_4_) != &local_3a0) {
        operator_delete((pointer *)CONCAT44(gtest_ar_6._4_4_,gtest_ar_6._0_4_));
      }
      if ((pointer *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != &local_328) {
        operator_delete((pointer *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
      }
      if (gtest_ar_4.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar);
        pcVar10 = "";
        if (gtest_ar_4.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar10 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
                   ,0x17b,pcVar10);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&gtest_ar)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
        if (CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != 0) {
          bVar8 = testing::internal::IsTrue(true);
          if ((bVar8) && ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&gtest_ar_4.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      uVar11 = uVar11 + 1;
    } while (uVar11 < (ulong)(((long)tx_peg_vector.
                                     super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               CONCAT71(tx_peg_vector.
                                        super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                        ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                        (char)tx_peg_vector.
                                              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                             -0x5555555555555555));
  }
  bVar8 = testing::internal::AlwaysTrue();
  if (bVar8) {
    bVar8 = testing::internal::AlwaysTrue();
    if (bVar8) {
      cfd::core::ConfidentialTransaction::GetWitnessOnlyHash();
      puVar7 = local_1d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar9 = (pointer)CONCAT71(gtest_ar._1_7_,gtest_ar.success_);
      local_1d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)gtest_ar.message_.ptr_;
      local_1d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_328;
      gtest_ar.success_ = false;
      gtest_ar._1_7_ = 0;
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_328 = (pointer)0x0;
      bVar8 = local_1d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0;
      local_1d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = puVar9;
      if (bVar8) {
        operator_delete(puVar7);
        if ((void *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (void *)0x0) {
          operator_delete((void *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        }
      }
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x17f,
               "Expected: (witness_only_hash = tx.GetWitnessOnlyHash()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
    if (CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != 0) {
      bVar8 = testing::internal::IsTrue(true);
      if ((bVar8) && ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
      }
    }
  }
  cfd::core::ByteData256::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_6,"witness_only_hash.GetHex().c_str()",
             "\"28fb92ba0f34d2073bbb6f41c262da513166a350b89da6103df13327ec8668fa\"",
             (char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_),
             "28fb92ba0f34d2073bbb6f41c262da513166a350b89da6103df13327ec8668fa");
  if ((pointer *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != &local_328) {
    operator_delete((pointer *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
  }
  if (gtest_ar_6.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_6.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((gtest_ar_6.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x182,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    if (CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != 0) {
      bVar8 = testing::internal::IsTrue(true);
      if ((bVar8) && ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_6.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar8 = testing::internal::AlwaysTrue();
  if (bVar8) {
    cfd::core::ConfidentialTransaction::RemovePeginWitnessStackAll((uint)&tx);
  }
  testing::Message::Message((Message *)&gtest_ar);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
             ,0x185,
             "Expected: (tx.RemovePeginWitnessStackAll(index + 5)) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&gtest_ar);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
  if (CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != 0) {
    bVar8 = testing::internal::IsTrue(true);
    if ((bVar8) && ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
    }
  }
  bVar8 = testing::internal::AlwaysTrue();
  if (bVar8) {
    bVar8 = testing::internal::AlwaysTrue();
    if (bVar8) {
      cfd::core::ConfidentialTransaction::RemovePeginWitnessStackAll((uint)&tx);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x186,
               "Expected: (tx.RemovePeginWitnessStackAll(index)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6);
    if (CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != 0) {
      bVar8 = testing::internal::IsTrue(true);
      if ((bVar8) && ((long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_) + 8))();
      }
    }
  }
  gtest_ar_6._0_4_ = cfd::core::ConfidentialTransaction::GetPeginWitnessStackNum((uint)&tx);
  gtest_ar_4.success_ = false;
  gtest_ar_4._1_3_ = 0;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"tx.GetPeginWitnessStackNum(index)","0",(uint *)&gtest_ar_6,
             (int *)&gtest_ar_4);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_6);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x187,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4,(Message *)&gtest_ar_6);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4);
    if (CONCAT44(gtest_ar_6._4_4_,gtest_ar_6._0_4_) != 0) {
      bVar8 = testing::internal::IsTrue(true);
      if ((bVar8) && ((long *)CONCAT44(gtest_ar_6._4_4_,gtest_ar_6._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(gtest_ar_6._4_4_,gtest_ar_6._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&tx_peg_vector);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&test_peg_vector);
  witness._vptr_ScriptWitness._0_4_ = 0x4d2f88;
  witness._vptr_ScriptWitness._4_4_ = 0;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            (&witness.witness_stack_);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction(&tx);
  if (local_1d8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d8.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_370);
  if (exp_data256.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(exp_data256.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (exp_data160.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(exp_data160.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (exp_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(exp_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  exp_pegin_witness._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_004d2f88;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            (&exp_pegin_witness.witness_stack_);
  return;
}

Assistant:

TEST(ConfidentialTransaction, PeginWitnessTest) {
  ScriptWitness exp_pegin_witness = GetExpectPeginWitnessStack();
  const ByteData exp_data("1234567890");
  const ByteData160 exp_data160("1234567890123456789012345678901234567890");
  const ByteData256 exp_data256(
      "1234567890123456789012345678901234567890123456789012345678901234");
  const std::vector<ByteData>& exp_peg_vector = exp_pegin_witness.GetWitness();
  ByteData256 witness_only_hash = ByteData256();

  ConfidentialTransaction tx(exp_tx_hex);
  uint32_t index = 0;
  EXPECT_NO_THROW(
      (index = tx.AddTxIn(exp_txid, exp_index, exp_sequence, exp_script)));
  EXPECT_NO_THROW(
      (tx.SetIssuance(index, exp_blinding_nonce, exp_asset_entropy,
                      exp_issuance_amount, exp_inflation_keys,
                      exp_issuance_amount_rangeproof,
                      exp_inflation_keys_rangeproof)));
  EXPECT_EQ(tx.GetPeginWitnessStackNum(index), 0);

  EXPECT_NO_THROW(
    (witness_only_hash = tx.GetWitnessOnlyHash()));
  EXPECT_STREQ(
    witness_only_hash.GetHex().c_str(),
    "5e1940c383c21cc75720f61fcc7cf95a056239ce73d5bd1cee1ff0c578bbcf99");

  // AddPeginWitness
  ScriptWitness witness;
  for (size_t idx = 0; idx < exp_peg_vector.size(); ++idx) {
    EXPECT_NO_THROW(
        (witness = tx.AddPeginWitnessStack(index, exp_peg_vector[idx])));
  }
  std::vector<ByteData> test_peg_vector = witness.GetWitness();
  for (size_t idx = 0; idx < exp_peg_vector.size(); ++idx) {
    EXPECT_STREQ(test_peg_vector[idx].GetHex().c_str(),
                 exp_peg_vector[idx].GetHex().c_str());
  }
  std::vector<ByteData> tx_peg_vector = tx.GetTxIn(index).GetPeginWitness()
      .GetWitness();
  for (size_t idx = 0; idx < tx_peg_vector.size(); ++idx) {
    EXPECT_STREQ(test_peg_vector[idx].GetHex().c_str(),
                 tx_peg_vector[idx].GetHex().c_str());
  }
  EXPECT_EQ(tx.GetPeginWitnessStackNum(index), exp_peg_vector.size());

  EXPECT_NO_THROW(
    (witness_only_hash = tx.GetWitnessOnlyHash()));
  EXPECT_STREQ(
    witness_only_hash.GetHex().c_str(),
    "7d3c4a5dbe536fd91715b2560826eae62f014cdefa02a0291b5c7dd9f3ad6b3a");

  // AddPeginWitness(160,256)
  EXPECT_THROW((witness = tx.AddPeginWitnessStack(index + 5, exp_data160)),
               CfdException);
  EXPECT_NO_THROW((witness = tx.AddPeginWitnessStack(index, exp_data160)));
  EXPECT_NO_THROW((witness = tx.AddPeginWitnessStack(index, exp_data256)));
  test_peg_vector = witness.GetWitness();
  EXPECT_STREQ(test_peg_vector[exp_peg_vector.size()].GetHex().c_str(),
               exp_data160.GetHex().c_str());
  EXPECT_STREQ(test_peg_vector[exp_peg_vector.size() + 1].GetHex().c_str(),
               exp_data256.GetHex().c_str());
  EXPECT_EQ(tx.GetPeginWitnessStackNum(index), exp_peg_vector.size() + 2);

  EXPECT_NO_THROW(
    (witness_only_hash = tx.GetWitnessOnlyHash()));
  EXPECT_STREQ(
    witness_only_hash.GetHex().c_str(),
    "ab4c6b401c0a47da16ee3b9135960bbfe7175de798ba398bbd6810b4fbbbcecf");

  // SetPeginWitnessStack
  EXPECT_THROW(
      (witness = tx.SetPeginWitnessStack(index + 5, static_cast<size_t>(exp_peg_vector.size()),
                                         exp_data160)),
      CfdException);
  EXPECT_THROW(
      (witness = tx.SetPeginWitnessStack(index, static_cast<size_t>(exp_peg_vector.size()) + 5,
                                         exp_data160)),
      CfdException);
  EXPECT_NO_THROW((witness = tx.SetPeginWitnessStack(index, 0, exp_data)));
  EXPECT_NO_THROW(
      (witness = tx.SetPeginWitnessStack(index, static_cast<size_t>(exp_peg_vector.size()),
                                         exp_data256)));
  EXPECT_NO_THROW(
      (witness = tx.SetPeginWitnessStack(index, static_cast<size_t>(exp_peg_vector.size()) + 1,
                                         exp_data160)));
  test_peg_vector = witness.GetWitness();
  EXPECT_STREQ(test_peg_vector[0].GetHex().c_str(), exp_data.GetHex().c_str());
  EXPECT_STREQ(test_peg_vector[exp_peg_vector.size()].GetHex().c_str(),
               exp_data256.GetHex().c_str());
  EXPECT_STREQ(test_peg_vector[exp_peg_vector.size() + 1].GetHex().c_str(),
               exp_data160.GetHex().c_str());
  tx_peg_vector = tx.GetTxIn(index).GetPeginWitness().GetWitness();
  for (size_t idx = 0; idx < tx_peg_vector.size(); ++idx) {
    EXPECT_STREQ(test_peg_vector[idx].GetHex().c_str(),
                 tx_peg_vector[idx].GetHex().c_str());
  }

  EXPECT_NO_THROW(
    (witness_only_hash = tx.GetWitnessOnlyHash()));
  EXPECT_STREQ(
    witness_only_hash.GetHex().c_str(),
    "28fb92ba0f34d2073bbb6f41c262da513166a350b89da6103df13327ec8668fa");

  // RemovePeginWitnessStackAll
  EXPECT_THROW((tx.RemovePeginWitnessStackAll(index + 5)), CfdException);
  EXPECT_NO_THROW((tx.RemovePeginWitnessStackAll(index)));
  EXPECT_EQ(tx.GetPeginWitnessStackNum(index), 0);
}